

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

void __thiscall
GF2::MP<45ul,GF2::MOGrlex<45ul>>::SymDiffNC<GF2::MOGrlex<45ul>>
          (MP<45UL,_GF2::MOGrlex<45UL>_> *this,MP<45UL,_GF2::MOGrlex<45UL>_> *polyRight)

{
  const_iterator __position;
  bool bVar1;
  int iVar2;
  _Self *__x;
  const_iterator in_RDI;
  int cmp;
  const_iterator iterRight;
  iterator iter;
  _List_node_base **in_stack_ffffffffffffff58;
  list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  reference in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  _List_const_iterator<GF2::MM<45UL>_> local_70;
  _List_node_base *local_68;
  _List_const_iterator<GF2::MM<45UL>_> local_60;
  _List_node_base *local_58;
  _List_const_iterator<GF2::MM<45UL>_> local_50;
  _List_node_base *local_48;
  _Self local_40;
  _Self local_38;
  int local_2c;
  _Self local_28;
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::begin
                 ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)in_stack_ffffffffffffff58)
  ;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::begin
                 ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)in_stack_ffffffffffffff58)
  ;
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::end
                   ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)
                    in_stack_ffffffffffffff58);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::end
                   ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)
                    in_stack_ffffffffffffff58);
    bVar1 = std::operator==(local_18,&local_38);
    if (bVar1) {
      iVar2 = -1;
    }
    else {
      in_stack_ffffffffffffff78 =
           std::_List_iterator<GF2::MM<45UL>_>::operator*
                     ((_List_iterator<GF2::MM<45UL>_> *)in_stack_ffffffffffffff60);
      std::_List_const_iterator<GF2::MM<45UL>_>::operator*
                ((_List_const_iterator<GF2::MM<45UL>_> *)in_stack_ffffffffffffff60);
      iVar2 = MOGrlex<45UL>::Compare
                        ((MOGrlex<45UL> *)
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                         (MM<45UL> *)in_stack_ffffffffffffff60,(MM<45UL> *)in_stack_ffffffffffffff58
                        );
    }
    local_2c = iVar2;
    if (iVar2 < 1) {
      while( true ) {
        in_stack_ffffffffffffff6f = false;
        if (local_2c < 0) {
          local_40._M_node =
               (_List_node_base *)
               std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::begin
                         ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)
                          in_stack_ffffffffffffff58);
          in_stack_ffffffffffffff6f = std::operator!=(local_18,&local_40);
        }
        if ((bool)in_stack_ffffffffffffff6f == false) break;
        in_stack_ffffffffffffff58 = &in_RDI._M_node[1]._M_prev;
        std::_List_iterator<GF2::MM<45UL>_>::operator--(local_18);
        in_stack_ffffffffffffff60 =
             (list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)
             std::_List_iterator<GF2::MM<45UL>_>::operator*
                       ((_List_iterator<GF2::MM<45UL>_> *)in_stack_ffffffffffffff60);
        std::_List_const_iterator<GF2::MM<45UL>_>::operator*
                  ((_List_const_iterator<GF2::MM<45UL>_> *)in_stack_ffffffffffffff60);
        local_2c = MOGrlex<45UL>::Compare
                             ((MOGrlex<45UL> *)
                              CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                              (MM<45UL> *)in_stack_ffffffffffffff60,
                              (MM<45UL> *)in_stack_ffffffffffffff58);
      }
      if (local_2c == 0) {
        std::_List_const_iterator<GF2::MM<45UL>_>::_List_const_iterator(&local_50,local_18);
        __position._M_node._7_1_ = in_stack_ffffffffffffff6f;
        __position._M_node._0_7_ = in_stack_ffffffffffffff68;
        local_48 = (_List_node_base *)
                   std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::erase
                             (in_stack_ffffffffffffff60,__position);
        local_18[0]._M_node = local_48;
      }
      else if (local_2c < 0) {
        std::_List_const_iterator<GF2::MM<45UL>_>::_List_const_iterator(&local_60,local_18);
        std::_List_const_iterator<GF2::MM<45UL>_>::operator*
                  ((_List_const_iterator<GF2::MM<45UL>_> *)in_stack_ffffffffffffff60);
        local_58 = (_List_node_base *)
                   std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::insert
                             ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)
                              CONCAT44(iVar2,in_stack_ffffffffffffff80),in_RDI,
                              in_stack_ffffffffffffff78);
        local_18[0]._M_node = local_58;
      }
      else if (0 < local_2c) {
        __x = std::_List_iterator<GF2::MM<45UL>_>::operator++(local_18);
        std::_List_const_iterator<GF2::MM<45UL>_>::_List_const_iterator(&local_70,__x);
        std::_List_const_iterator<GF2::MM<45UL>_>::operator*
                  ((_List_const_iterator<GF2::MM<45UL>_> *)in_stack_ffffffffffffff60);
        local_68 = (_List_node_base *)
                   std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::insert
                             ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)
                              CONCAT44(iVar2,in_stack_ffffffffffffff80),in_RDI,
                              in_stack_ffffffffffffff78);
        local_18[0]._M_node = local_68;
      }
      std::_List_const_iterator<GF2::MM<45UL>_>::operator++(&local_20);
    }
    else {
      std::_List_iterator<GF2::MM<45UL>_>::operator++(local_18);
    }
  }
  return;
}

Assistant:

void SymDiffNC(const MP<_n, _O1>& polyRight)
	{
		iterator iter = begin();
		auto iterRight = polyRight.begin();
		while (iterRight != polyRight.end())
		{
			// сравнить текущие элементы списков
			int cmp = (iter == end()) ? -1 : _order.Compare(*iter, *iterRight);
			if (cmp > 0) ++iter;
			else
			{
				// откат назад
				while (cmp < 0 && iter != begin())
					cmp = _order.Compare(*--iter, *iterRight);
				// нашли *iterRight?
				if (cmp == 0) 
					// удалить
					iter = erase(iter);
				// *iterRight > всех мономов списка-назначения?
				else if (cmp < 0)
					// вставить *iterRight в начало списка
					iter = insert(iter, *iterRight);
				// *iter > *iterRight > *(++iter)?
				else if (cmp > 0)
					// вставить *iterRight после *iter
					iter = insert(++iter, *iterRight);
				// перейти к следующему моному
				++iterRight;
			}
		}
	}